

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_avx2.cpp
# Opt level: O1

void intermediate_adder_avx2
               (uint *b,uint *end,IntermediateBuffer *intermediate,int offset,int *fx,int fdx)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 in_ZMM7 [64];
  undefined1 in_ZMM8 [64];
  
  uVar5 = *fx + offset * -0x10000;
  *fx = uVar5;
  auVar4 = _DAT_006cec20;
  auVar11 = vpinsrd_avx(ZEXT416(uVar5),uVar5 + fdx,1);
  iVar6 = uVar5 + fdx + fdx;
  auVar11 = vpinsrd_avx(auVar11,iVar6,2);
  auVar11 = vpinsrd_avx(auVar11,iVar6 + fdx,3);
  auVar10 = ZEXT1664(auVar11);
  if (b < (undefined1 (*) [16])(end + -3)) {
    iVar6 = fdx * 4;
    auVar11._4_4_ = iVar6;
    auVar11._0_4_ = iVar6;
    auVar11._8_4_ = iVar6;
    auVar11._12_4_ = iVar6;
    auVar12._8_2_ = 0x100;
    auVar12._0_8_ = 0x100010001000100;
    auVar12._10_2_ = 0x100;
    auVar12._12_2_ = 0x100;
    auVar12._14_2_ = 0x100;
    auVar13._8_2_ = 0xff;
    auVar13._0_8_ = 0xff00ff00ff00ff;
    auVar13._10_2_ = 0xff;
    auVar13._12_2_ = 0xff;
    auVar13._14_2_ = 0xff;
    do {
      auVar9 = auVar10._0_16_;
      vpsrld_avx(auVar9,0x10);
      auVar3 = vpcmpeqd_avx2(in_ZMM7._0_32_,in_ZMM7._0_32_);
      auVar16 = vpgatherdq(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar3);
      auVar3 = vpcmpeqd_avx2(in_ZMM8._0_32_,in_ZMM8._0_32_);
      auVar17 = vpgatherdq(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar3);
      in_ZMM7 = ZEXT3264(auVar17);
      auVar15 = vpshufb_avx(auVar9,auVar4);
      auVar1 = vpsubw_avx(auVar12,auVar15);
      in_ZMM8 = ZEXT1664(auVar1);
      auVar2 = vpunpckldq_avx(auVar1,auVar15);
      auVar15 = vpunpckhdq_avx(auVar1,auVar15);
      auVar14._0_16_ = ZEXT116(0) * auVar15 + ZEXT116(1) * auVar2;
      auVar14._16_16_ = ZEXT116(1) * auVar15;
      auVar3 = vpmullw_avx2(auVar16,auVar14);
      auVar14 = vpmullw_avx2(auVar17,auVar14);
      auVar3 = vphaddd_avx2(auVar3,auVar14);
      auVar3 = vpermq_avx2(auVar3,0xd8);
      auVar15 = vpsrlw_avx(auVar3._0_16_,8);
      auVar15 = vpblendvb_avx(auVar3._16_16_,auVar15,auVar13);
      *(undefined1 (*) [16])b = auVar15;
      b = (uint *)((long)b + 0x10);
      auVar15 = vpaddd_avx(auVar9,auVar11);
      auVar10 = ZEXT1664(auVar15);
    } while (b < (undefined1 (*) [16])(end + -3));
  }
  uVar5 = auVar10._0_4_;
  *fx = uVar5;
  for (; b < end; b = (uint *)(*(undefined1 (*) [16])b + 4)) {
    uVar8 = uVar5 >> 8 & 0xff;
    lVar7 = (long)((int)uVar5 >> 0x10);
    *(quint32 *)*(undefined1 (*) [16])b =
         intermediate->buffer_rb[lVar7 + 1] * uVar8 +
         intermediate->buffer_rb[lVar7] * (0x100 - uVar8) >> 8 & 0xff00ff |
         uVar8 * intermediate->buffer_ag[lVar7 + 1] +
         (0x100 - uVar8) * intermediate->buffer_ag[lVar7] & 0xff00ff00;
    uVar5 = *fx + fdx;
    *fx = uVar5;
  }
  *fx = uVar5 + offset * 0x10000;
  return;
}

Assistant:

void QT_FASTCALL intermediate_adder_avx2(uint *b, uint *end, const IntermediateBuffer &intermediate, int offset, int &fx, int fdx)
{
    fx -= offset * FixedScale;

    const __m128i v_fdx = _mm_set1_epi32(fdx * 4);
    const __m128i v_blend = _mm_set1_epi32(0x00800080);
    const __m128i vdx_shuffle = _mm_set_epi8(char(0x80), 13, char(0x80), 13, char(0x80), 9, char(0x80), 9,
                                             char(0x80),  5, char(0x80),  5, char(0x80), 1, char(0x80), 1);
    __m128i v_fx = _mm_setr_epi32(fx, fx + fdx, fx + fdx + fdx, fx + fdx + fdx + fdx);

    while (b < end - 3) {
        const __m128i offset = _mm_srli_epi32(v_fx, 16);
        __m256i vrb = _mm256_i32gather_epi64((const long long *)intermediate.buffer_rb, offset, 4);
        __m256i vag = _mm256_i32gather_epi64((const long long *)intermediate.buffer_ag, offset, 4);

        __m128i vdx = _mm_shuffle_epi8(v_fx, vdx_shuffle);
        __m128i vidx = _mm_sub_epi16(_mm_set1_epi16(256), vdx);
        __m256i vmulx = _mm256_castsi128_si256(_mm_unpacklo_epi32(vidx, vdx));
        vmulx = _mm256_inserti128_si256(vmulx, _mm_unpackhi_epi32(vidx, vdx), 1);

        vrb = _mm256_mullo_epi16(vrb, vmulx);
        vag = _mm256_mullo_epi16(vag, vmulx);

        __m256i vrbag = _mm256_hadd_epi32(vrb, vag);
        vrbag = _mm256_permute4x64_epi64(vrbag, _MM_SHUFFLE(3, 1, 2, 0));

        __m128i rb = _mm256_castsi256_si128(vrbag);
        __m128i ag = _mm256_extracti128_si256(vrbag, 1);
        rb = _mm_srli_epi16(rb, 8);

        _mm_storeu_si128((__m128i*)b, _mm_blendv_epi8(ag, rb, v_blend));

        b += 4;
        v_fx = _mm_add_epi32(v_fx, v_fdx);
    }
    fx = _mm_cvtsi128_si32(v_fx);
    while (b < end) {
        const int x = (fx >> 16);

        const uint distx = (fx & 0x0000ffff) >> 8;
        const uint idistx = 256 - distx;
        const uint rb = (intermediate.buffer_rb[x] * idistx + intermediate.buffer_rb[x + 1] * distx) & 0xff00ff00;
        const uint ag = (intermediate.buffer_ag[x] * idistx + intermediate.buffer_ag[x + 1] * distx) & 0xff00ff00;
        *b = (rb >> 8) | ag;
        b++;
        fx += fdx;
    }
    fx += offset * FixedScale;
}